

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hadvuv.h
# Opt level: O0

ElementType
advectionDriver(Storage3D field,int64_t i,int64_t j,int64_t k,ElementType uavg,ElementType vavg,
               ElementType eddlat,ElementType eddlon)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double local_50;
  ElementType result_y;
  ElementType result_x;
  ElementType eddlon_local;
  ElementType eddlat_local;
  ElementType vavg_local;
  ElementType uavg_local;
  int64_t k_local;
  int64_t j_local;
  int64_t i_local;
  
  if (uavg <= 0.0) {
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + -1,j,k);
    dVar1 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j,k);
    dVar2 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + 1,j,k);
    dVar3 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + 2,j,k);
    result_y = -uavg * (*pdVar4 * -0.16666666666666666 +
                       dVar1 * -0.3333333333333333 + dVar2 * -0.5 + dVar3);
  }
  else {
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + -2,j,k);
    dVar1 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + -1,j,k);
    dVar2 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j,k);
    dVar3 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i + 1,j,k);
    result_y = uavg * (*pdVar4 * -0.3333333333333333 +
                      dVar3 * -0.5 + dVar1 * -0.16666666666666666 + dVar2);
  }
  if (vavg <= 0.0) {
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + -1,k);
    dVar1 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j,k);
    dVar2 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + 1,k);
    dVar3 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + 2,k);
    local_50 = -vavg * (*pdVar4 * -0.16666666666666666 +
                       dVar1 * -0.3333333333333333 + dVar2 * -0.5 + dVar3);
  }
  else {
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + -2,k);
    dVar1 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + -1,k);
    dVar2 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j,k);
    dVar3 = *pdVar4;
    pdVar4 = (anonymous_namespace)::Storage<double,3ul>::operator()
                       ((Storage<double,3ul> *)&field,i,j + 1,k);
    local_50 = vavg * (*pdVar4 * -0.3333333333333333 +
                      dVar3 * -0.5 + dVar1 * -0.16666666666666666 + dVar2);
  }
  return eddlat * result_y + eddlon * local_50;
}

Assistant:

ElementType advectionDriver(const Storage3D field, const int64_t i, const int64_t j, const int64_t k, const ElementType uavg, const ElementType vavg,
                            const ElementType eddlat, const ElementType eddlon) {
  ElementType result_x = 0.0;
  ElementType result_y = 0.0;

  if(uavg > 0) {
    result_x = uavg*
        (ElementType(-1.0)/ElementType(6.0)*field(i-2, j, k) +
                                            field(i-1, j, k) +
                          ElementType(-0.5)*field(i  , j, k) +
         ElementType(-1.0)/ElementType(3.0)*field(i+1, j, k));
  }
  else
  {
    result_x = -uavg*
        (ElementType(-1.0)/ElementType(3.0)*field(i-1, j, k) +
                          ElementType(-0.5)*field(i  , j, k) +
                                            field(i+1, j, k) +
         ElementType(-1.0)/ElementType(6.0)*field(i+2, j, k));
  }

  if(vavg > 0) {
    result_y = vavg*
        (ElementType(-1.0)/ElementType(6.0)*field(i, j-2, k) +
                                            field(i, j-1, k) +
                          ElementType(-0.5)*field(i, j  , k) +
         ElementType(-1.0)/ElementType(3.0)*field(i, j+1, k));
  }
  else
  {
    result_y = -vavg*
        (ElementType(-1.0)/ElementType(3.0)*field(i, j-1, k) +
                          ElementType(-0.5)*field(i, j  , k) +
                                            field(i, j+1, k) +
         ElementType(-1.0)/ElementType(6.0)*field(i, j+2, k));
  }

  return eddlat*result_x + eddlon*result_y;
}